

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O2

_Bool borg_quaff_crit(_Bool no_check)

{
  _Bool _Var1;
  uint32_t uVar2;
  undefined7 in_register_00000039;
  
  if ((((int)CONCAT71(in_register_00000039,no_check) != 0) ||
      (((borg_t < borg_quaff_crit::when_last_quaff ||
         (int)borg_quaff_crit::when_last_quaff <= borg_t + -4 ||
        (uVar2 = Rand_div(100), 0x49 < (int)uVar2)) && (1 < borg_skill[0xd0])))) &&
     (_Var1 = borg_quaff_potion(sv_potion_cure_critical), _Var1)) {
    borg_quaff_crit::when_last_quaff = borg_t;
    return true;
  }
  return false;
}

Assistant:

bool borg_quaff_crit(bool no_check)
{
    static int16_t when_last_quaff = 0;

    if (no_check) {
        if (borg_quaff_potion(sv_potion_cure_critical)) {
            when_last_quaff = borg_t;
            return (true);
        }
        return (false);
    }

    /* Avoid drinking CCW twice in a row */
    if (when_last_quaff > (borg_t - 4) && when_last_quaff <= borg_t
        && (randint1(100) < 75))
        return false;

    /* Save the last two for when we really need them */
    if (borg_skill[BI_ACCW] < 2)
        return false;

    if (borg_quaff_potion(sv_potion_cure_critical)) {
        when_last_quaff = borg_t;
        return (true);
    }
    return (false);
}